

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gopher.c
# Opt level: O0

CURLcode gopher_do(connectdata *conn,_Bool *done)

{
  size_t sVar1;
  int local_84;
  ulong uStack_80;
  int len;
  size_t i;
  size_t j;
  char *newp;
  ssize_t k;
  ssize_t amount;
  char *sel_org;
  char *sel;
  char *path;
  curl_off_t *bytecount;
  SessionHandle *pSStack_30;
  curl_socket_t sockfd;
  SessionHandle *data;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  pSStack_30 = conn->data;
  bytecount._4_4_ = conn->sock[0];
  path = (char *)&(pSStack_30->req).bytecount;
  sel = (pSStack_30->state).path;
  amount = 0;
  *done = true;
  p_Stack_20 = done;
  done_local = (_Bool *)conn;
  sVar1 = strlen(sel);
  if (sVar1 < 3) {
    sel_org = "";
  }
  else {
    j = (size_t)(sel + 2);
    i = strlen((char *)j);
    for (uStack_80 = 0; uStack_80 < i; uStack_80 = uStack_80 + 1) {
      if (*(char *)(j + uStack_80) == '?') {
        *(undefined1 *)(j + uStack_80) = 9;
      }
    }
    amount = (ssize_t)curl_easy_unescape(pSStack_30,(char *)j,0,&local_84);
    sel_org = (char *)amount;
    if ((char *)amount == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  sVar1 = strlen(sel_org);
  newp = (char *)curlx_uztosz(sVar1);
  while( true ) {
    data._4_4_ = Curl_write((connectdata *)done_local,bytecount._4_4_,sel_org,(size_t)newp,&k);
    if (data._4_4_ != CURLE_OK) {
      Curl_failf(pSStack_30,"Failed sending Gopher request");
      if (amount != 0) {
        (*Curl_cfree)((void *)amount);
      }
      return data._4_4_;
    }
    data._4_4_ = Curl_client_write((connectdata *)done_local,2,sel_org,k);
    if (data._4_4_ != CURLE_OK) break;
    newp = newp + -k;
    sel_org = sel_org + k;
    if ((long)newp < 1) {
      if (amount != 0) {
        (*Curl_cfree)((void *)amount);
        amount = 0;
      }
      data._4_4_ = Curl_sendf(bytecount._4_4_,(connectdata *)done_local,"\r\n");
      if (data._4_4_ != CURLE_OK) {
        Curl_failf(pSStack_30,"Failed sending Gopher request");
        return data._4_4_;
      }
      data._4_4_ = Curl_client_write((connectdata *)done_local,2,"\r\n",2);
      if (data._4_4_ != CURLE_OK) {
        return data._4_4_;
      }
      Curl_setup_transfer((connectdata *)done_local,0,-1,false,(curl_off_t *)path,-1,
                          (curl_off_t *)0x0);
      return CURLE_OK;
    }
    Curl_socket_check(-1,-1,bytecount._4_4_,100);
  }
  if (amount != 0) {
    (*Curl_cfree)((void *)amount);
  }
  return data._4_4_;
}

Assistant:

static CURLcode gopher_do(struct connectdata *conn, bool *done)
{
  CURLcode result=CURLE_OK;
  struct SessionHandle *data=conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];

  curl_off_t *bytecount = &data->req.bytecount;
  char *path = data->state.path;
  char *sel;
  char *sel_org = NULL;
  ssize_t amount, k;

  *done = TRUE; /* unconditionally */

  /* Create selector. Degenerate cases: / and /1 => convert to "" */
  if(strlen(path) <= 2)
    sel = (char *)"";
  else {
    char *newp;
    size_t j, i;
    int len;

    /* Otherwise, drop / and the first character (i.e., item type) ... */
    newp = path;
    newp+=2;

    /* ... then turn ? into TAB for search servers, Veronica, etc. ... */
    j = strlen(newp);
    for(i=0; i<j; i++)
      if(newp[i] == '?')
        newp[i] = '\x09';

    /* ... and finally unescape */
    sel = curl_easy_unescape(data, newp, 0, &len);
    if(!sel)
      return CURLE_OUT_OF_MEMORY;
    sel_org = sel;
  }

  /* We use Curl_write instead of Curl_sendf to make sure the entire buffer is
     sent, which could be sizeable with long selectors. */
  k = curlx_uztosz(strlen(sel));

  for(;;) {
    result = Curl_write(conn, sockfd, sel, k, &amount);
    if(CURLE_OK == result) { /* Which may not have written it all! */
      result = Curl_client_write(conn, CLIENTWRITE_HEADER, sel, amount);
      if(result) {
        Curl_safefree(sel_org);
        return result;
      }
      k -= amount;
      sel += amount;
      if(k < 1)
        break; /* but it did write it all */
    }
    else {
      failf(data, "Failed sending Gopher request");
      Curl_safefree(sel_org);
      return result;
    }
    /* Don't busyloop. The entire loop thing is a work-around as it causes a
       BLOCKING behavior which is a NO-NO. This function should rather be
       split up in a do and a doing piece where the pieces that aren't
       possible to send now will be sent in the doing function repeatedly
       until the entire request is sent.

       Wait a while for the socket to be writable. Note that this doesn't
       acknowledge the timeout.
    */
    Curl_socket_ready(CURL_SOCKET_BAD, sockfd, 100);
  }

  Curl_safefree(sel_org);

  /* We can use Curl_sendf to send the terminal \r\n relatively safely and
     save allocing another string/doing another _write loop. */
  result = Curl_sendf(sockfd, conn, "\r\n");
  if(result != CURLE_OK) {
    failf(data, "Failed sending Gopher request");
    return result;
  }
  result = Curl_client_write(conn, CLIENTWRITE_HEADER, (char *)"\r\n", 2);
  if(result)
    return result;

  Curl_setup_transfer(conn, FIRSTSOCKET, -1, FALSE, bytecount,
                      -1, NULL); /* no upload */
  return CURLE_OK;
}